

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::FieldMaskUtil::IsPathInFieldMask
          (FieldMaskUtil *this,string_view path,FieldMask *mask)

{
  pointer __s2;
  FieldMaskUtil *__n;
  int iVar1;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar2;
  char *pcVar3;
  int index;
  void *__s1;
  size_type __rlen;
  
  pcVar3 = path._M_str;
  __s1 = (void *)path._M_len;
  index = 0;
  if (0 < *(int *)(pcVar3 + 0x18)) {
    do {
      pVVar2 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)(pcVar3 + 0x10),index);
      __s2 = (pVVar2->_M_dataplus)._M_p;
      __n = (FieldMaskUtil *)pVVar2->_M_string_length;
      if (__n == this) {
        if (this == (FieldMaskUtil *)0x0) {
          return true;
        }
        iVar1 = bcmp(__s1,__s2,(size_t)this);
        if (iVar1 == 0) {
          return true;
        }
      }
      if ((__n < this) &&
         (((__n == (FieldMaskUtil *)0x0 || (iVar1 = bcmp(__s1,__s2,(size_t)__n), iVar1 == 0)) &&
          (*(FieldMaskUtil *)((long)__s1 + (long)__n) == (FieldMaskUtil)0x2e)))) {
        return true;
      }
      index = index + 1;
    } while (index < *(int *)(pcVar3 + 0x18));
  }
  return false;
}

Assistant:

bool FieldMaskUtil::IsPathInFieldMask(absl::string_view path,
                                      const FieldMask& mask) {
  for (int i = 0; i < mask.paths_size(); ++i) {
    absl::string_view current = path;
    absl::string_view mask_path = mask.paths(i);
    if (current == mask_path) {
      return true;
    }
      // Also check whether mask.paths(i) is a prefix of path.
    if (mask_path.length() < current.length() &&
        absl::ConsumePrefix(&current, mask_path) &&
        absl::ConsumePrefix(&current, ".")) {
      return true;
    }
  }
  return false;
}